

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGenerator.h
# Opt level: O0

void generateHeaps(int size,int heapNumber,HeapList *heaps,vector<int,_std::allocator<int>_> *order,
                  vector<int,_std::allocator<int>_> *values)

{
  int index;
  int *piVar1;
  reference pvVar2;
  int local_30;
  int local_2c;
  int i_1;
  int i;
  vector<int,_std::allocator<int>_> *values_local;
  vector<int,_std::allocator<int>_> *order_local;
  HeapList *heaps_local;
  int heapNumber_local;
  int size_local;
  
  local_2c = 0;
  heaps_local._0_4_ = heapNumber;
  heaps_local._4_4_ = size;
  while( true ) {
    piVar1 = std::min<int>((int *)&heaps_local,(int *)((long)&heaps_local + 4));
    if (*piVar1 <= local_2c) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](values,(long)local_2c);
    HeapList::AddHeap(heaps,*pvVar2);
    local_2c = local_2c + 1;
  }
  piVar1 = std::min<int>((int *)&heaps_local,(int *)((long)&heaps_local + 4));
  for (local_30 = *piVar1; local_30 < heaps_local._4_4_; local_30 = local_30 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](order,(long)local_30);
    index = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](values,(long)local_30);
    HeapList::Insert(heaps,index,*pvVar2);
  }
  return;
}

Assistant:

void generateHeaps(int size, int heapNumber, HeapList& heaps, std::vector<int>& order, std::vector<int>& values) {

    for (int i = 0; i < std::min(heapNumber, size); i++)
        heaps.AddHeap(values[i]);

    for (int i = std::min(heapNumber, size); i < size; i++)
        heaps.Insert(order[i], values[i]);
}